

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_erase(wchar_t x,wchar_t y,wchar_t n)

{
  wchar_t wVar1;
  term_win *ptVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int *piVar5;
  wchar_t *pwVar6;
  term *ptVar7;
  errr eVar8;
  int iVar9;
  wchar_t wVar10;
  wchar_t w;
  int iVar11;
  long lVar12;
  
  ptVar7 = Term;
  wVar1 = Term->wid;
  eVar8 = -1;
  if ((((wVar1 - x != L'\0' && x <= wVar1) && L'\xffffffff' < x) && (L'\xffffffff' < y)) &&
     (y < Term->hgt)) {
    ptVar2 = Term->scr;
    ptVar2->cx = x;
    ptVar2->cy = y;
    ptVar2->cu = false;
    wVar10 = wVar1 - x;
    if (n + x <= wVar1) {
      wVar10 = n;
    }
    if (wVar10 < L'\x01') {
      eVar8 = 0;
    }
    else {
      piVar3 = ptVar2->a[(uint)y];
      pwVar4 = ptVar2->c[(uint)y];
      piVar5 = ptVar2->ta[(uint)y];
      pwVar6 = ptVar2->tc[(uint)y];
      iVar9 = -1;
      lVar12 = 0;
      iVar11 = -1;
      do {
        if ((piVar3[(ulong)(uint)x + lVar12] != 1) || (pwVar4[(ulong)(uint)x + lVar12] != L' ')) {
          piVar3[(ulong)(uint)x + lVar12] = 1;
          pwVar4[(ulong)(uint)x + lVar12] = L' ';
          piVar5[(ulong)(uint)x + lVar12] = 0;
          pwVar6[(ulong)(uint)x + lVar12] = L'\0';
          iVar11 = x + (int)lVar12;
          if (iVar9 < 0) {
            iVar9 = iVar11;
          }
        }
        lVar12 = lVar12 + 1;
      } while ((wchar_t)lVar12 < wVar10);
      eVar8 = 0;
      if (-1 < iVar9) {
        if (y < ptVar7->y1) {
          ptVar7->y1 = y;
        }
        if (ptVar7->y2 < y) {
          ptVar7->y2 = y;
        }
        if (iVar9 < ptVar7->x1[(uint)y]) {
          ptVar7->x1[(uint)y] = iVar9;
        }
        eVar8 = 0;
        if (ptVar7->x2[(uint)y] < iVar11) {
          ptVar7->x2[(uint)y] = iVar11;
          eVar8 = 0;
        }
      }
    }
  }
  return eVar8;
}

Assistant:

errr Term_erase(int x, int y, int n)
{
	int i;

	int w = Term->wid;
	/* int h = Term->hgt; */

	int x1 = -1;
	int x2 = -1;

	int *scr_aa;
	wchar_t *scr_cc;

	int *scr_taa;
	wchar_t *scr_tcc;

	/* Place cursor */
	if (Term_gotoxy(x, y)) return (-1);

	/* Force legal size */
	if (x + n > w) n = w - x;

	/* Fast access */
	scr_aa = Term->scr->a[y];
	scr_cc = Term->scr->c[y];

	scr_taa = Term->scr->ta[y];
	scr_tcc = Term->scr->tc[y];

	/* Scan every column */
	for (i = 0; i < n; i++, x++) {
		int oa = scr_aa[x];
		wchar_t oc = scr_cc[x];

		/* Hack -- Ignore "non-changes" */
		if ((oa == COLOUR_WHITE) && (oc == ' ')) continue;

		/* Save the "literal" information */
		scr_aa[x] = COLOUR_WHITE;
		scr_cc[x] = ' ';

		scr_taa[x] = 0;
		scr_tcc[x] = 0;

		/* Track minimum changed column */
		if (x1 < 0) x1 = x;

		/* Track maximum changed column */
		x2 = x;
	}

	/* Expand the "change area" as needed */
	if (x1 >= 0) {
		/* Check for new min/max row info */
		if (y < Term->y1) Term->y1 = y;
		if (y > Term->y2) Term->y2 = y;

		/* Check for new min/max col info in this row */
		if (x1 < Term->x1[y]) Term->x1[y] = x1;
		if (x2 > Term->x2[y]) Term->x2[y] = x2;
	}

	/* Success */
	return (0);
}